

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * __thiscall
CTPNStmReturnBase::fold_constants(CTPNStmReturnBase *this,CTcPrsSymtab *symtab)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  CTcTokenizer *pCVar4;
  int iVar5;
  undefined4 extraout_var;
  
  pCVar4 = G_tok;
  uVar1 = *(undefined4 *)((long)&(this->super_CTPNStm).super_CTPNStmBase.file_ + 4);
  lVar3 = (this->super_CTPNStm).super_CTPNStmBase.linenum_;
  uVar2 = *(undefined4 *)((long)&(this->super_CTPNStm).super_CTPNStmBase.linenum_ + 4);
  *(undefined4 *)&G_tok->last_desc_ = *(undefined4 *)&(this->super_CTPNStm).super_CTPNStmBase.file_;
  *(undefined4 *)((long)&pCVar4->last_desc_ + 4) = uVar1;
  *(int *)&pCVar4->last_linenum_ = (int)lVar3;
  *(undefined4 *)((long)&pCVar4->last_linenum_ + 4) = uVar2;
  if (this->expr_ != (CTcPrsNode *)0x0) {
    iVar5 = (*(this->expr_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xf])();
    this->expr_ = (CTcPrsNode *)CONCAT44(extraout_var,iVar5);
  }
  return (CTcPrsNode *)this;
}

Assistant:

CTcPrsNode *CTPNStmReturnBase::fold_constants(CTcPrsSymtab *symtab)
{
    /* set our location for any errors that occur */
    G_tok->set_line_info(get_source_desc(), get_source_linenum());

    /* fold constants in the expression, if we have one */
    if (expr_ != 0)
        expr_ = expr_->fold_constants(symtab);

    /* we are not directly changed by this operation */
    return this;
}